

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O3

void __thiscall spdlog::logger::swap(logger *this,logger *other)

{
  __int_type _Var1;
  pointer psVar2;
  _Manager_type p_Var3;
  _Invoker_type p_Var4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  _Any_data __tmp;
  
  std::__cxx11::string::swap((string *)&this->name_);
  psVar2 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar5 = (other->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar6 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->sinks_).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->sinks_).
       super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->sinks_).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar5;
  (this->sinks_).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->sinks_).
       super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->sinks_).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar6;
  (other->sinks_).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar7;
  (other->sinks_).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar2;
  LOCK();
  _Var1 = (this->level_).super___atomic_base<int>._M_i;
  (this->level_).super___atomic_base<int>._M_i = (other->level_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (other->level_).super___atomic_base<int>._M_i = _Var1;
  UNLOCK();
  LOCK();
  _Var1 = (this->flush_level_).super___atomic_base<int>._M_i;
  (this->flush_level_).super___atomic_base<int>._M_i =
       (other->flush_level_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (other->flush_level_).super___atomic_base<int>._M_i = _Var1;
  UNLOCK();
  uVar8 = *(undefined8 *)&(this->custom_err_handler_).super__Function_base._M_functor;
  uVar9 = *(undefined8 *)((long)&(this->custom_err_handler_).super__Function_base._M_functor + 8);
  uVar10 = *(undefined8 *)((long)&(other->custom_err_handler_).super__Function_base._M_functor + 8);
  *(undefined8 *)&(this->custom_err_handler_).super__Function_base._M_functor =
       *(undefined8 *)&(other->custom_err_handler_).super__Function_base._M_functor;
  *(undefined8 *)((long)&(this->custom_err_handler_).super__Function_base._M_functor + 8) = uVar10;
  *(undefined8 *)&(other->custom_err_handler_).super__Function_base._M_functor = uVar8;
  *(undefined8 *)((long)&(other->custom_err_handler_).super__Function_base._M_functor + 8) = uVar9;
  p_Var3 = (this->custom_err_handler_).super__Function_base._M_manager;
  (this->custom_err_handler_).super__Function_base._M_manager =
       (other->custom_err_handler_).super__Function_base._M_manager;
  (other->custom_err_handler_).super__Function_base._M_manager = p_Var3;
  p_Var4 = (this->custom_err_handler_)._M_invoker;
  (this->custom_err_handler_)._M_invoker = (other->custom_err_handler_)._M_invoker;
  (other->custom_err_handler_)._M_invoker = p_Var4;
  std::swap<spdlog::details::backtracer>(&this->tracer_,&other->tracer_);
  return;
}

Assistant:

SPDLOG_INLINE void logger::swap(spdlog::logger &other) SPDLOG_NOEXCEPT
{
    name_.swap(other.name_);
    sinks_.swap(other.sinks_);

    // swap level_
    auto other_level = other.level_.load();
    auto my_level = level_.exchange(other_level);
    other.level_.store(my_level);

    // swap flush level_
    other_level = other.flush_level_.load();
    my_level = flush_level_.exchange(other_level);
    other.flush_level_.store(my_level);

    custom_err_handler_.swap(other.custom_err_handler_);
    std::swap(tracer_, other.tracer_);
}